

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void parser_eat_newline(VrplibParser *p)

{
  long lVar1;
  char *pcVar2;
  long lVar3;
  
  parser_eat_whitespaces(p);
  lVar1 = -p->size;
  pcVar2 = p->at;
  while( true ) {
    while( true ) {
      lVar3 = (long)p->base - (long)pcVar2;
      if (lVar3 == lVar1) {
        return;
      }
      if (*pcVar2 != '\n') break;
      p->curline = p->curline + 1;
      pcVar2 = pcVar2 + (lVar3 != lVar1);
      p->at = pcVar2;
    }
    if (*pcVar2 != '\r') break;
    pcVar2 = pcVar2 + (lVar3 != lVar1);
    p->at = pcVar2;
    if (((long)p->base - (long)pcVar2 != lVar1) && (*pcVar2 == '\n')) {
      pcVar2 = pcVar2 + 1;
      p->at = pcVar2;
    }
    p->curline = p->curline + 1;
  }
  return;
}

Assistant:

static void parser_eat_newline(VrplibParser *p) {
    parser_eat_whitespaces(p);

    while (!parser_is_eof(p) && (*p->at == '\r' || *p->at == '\n')) {
        if (*p->at == '\r') {
            parser_adv(p, 1);
            if (!parser_is_eof(p) && (*p->at == '\n')) {
                parser_adv(p, 1);
            }
            p->curline += 1;
        } else {
            assert(*p->at == '\n');
            p->curline += 1;
            parser_adv(p, 1);
        }
    }
}